

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-target.c
# Opt level: O1

_Bool aux_terrain(chunk *c,player *p,target_aux_state *auxst)

{
  keycode_t kVar1;
  _Bool _Var2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  long lVar7;
  bool bVar8;
  ui_event uVar9;
  char out_val [256];
  
  if ((auxst->boring == false) &&
     (_Var2 = square_isinteresting((chunk_conflict *)p->cave,auxst->grid), !_Var2)) {
    return false;
  }
  pcVar3 = square_apparent_name((chunk_conflict *)p->cave,auxst->grid);
  if (*auxst->phrase2 == '\0') {
    pcVar4 = "";
  }
  else {
    pcVar4 = square_apparent_look_in_preposition((chunk_conflict *)p->cave,auxst->grid);
  }
  pcVar5 = square_apparent_look_prefix((chunk_conflict *)p->cave,auxst->grid);
  if (p->wizard == true) {
    lVar6 = (long)(auxst->grid).y;
    lVar7 = (long)(auxst->grid).x;
    strnfmt(out_val,0x100,"%s%s%s%s, %s (%d:%d, noise=%d, scent=%d).",auxst->phrase1,pcVar4,pcVar5,
            pcVar3,auxst,lVar6,lVar7,(ulong)(c->noise).grids[lVar6][lVar7],
            (ulong)(c->scent).grids[lVar6][lVar7]);
  }
  else {
    strnfmt(out_val,0x100,"%s%s%s%s, %s.",auxst->phrase1,pcVar4,pcVar5,pcVar3,auxst);
  }
  prt(out_val,L'\0',L'\0');
  move_cursor_relative((auxst->grid).y,(auxst->grid).x);
  uVar9 = inkey_m();
  (auxst->press).mouse = uVar9.mouse;
  (auxst->press).key.mods = uVar9.key.mods;
  if (uVar9.type == EVT_MOUSE) {
    bVar8 = (auxst->press).mouse.button == '\x02';
  }
  else {
    kVar1 = (auxst->press).key.code;
    bVar8 = kVar1 != 0x20 && kVar1 != 0x9c;
  }
  return bVar8;
}

Assistant:

static bool aux_terrain(struct chunk *c, struct player *p,
		struct target_aux_state *auxst)
{
	const char *name, *lphrase2, *lphrase3;
	char out_val[TARGET_OUT_VAL_SIZE];

	if (!auxst->boring && !square_isinteresting(p->cave, auxst->grid))
		return false;

	/* Terrain feature if needed */
	name = square_apparent_name(p->cave, auxst->grid);

	/* Hack -- handle unknown grids */

	/* Pick a preposition if needed */
	lphrase2 = (*auxst->phrase2) ?
		square_apparent_look_in_preposition(p->cave, auxst->grid) : "";

	/* Pick prefix for the name */
	lphrase3 = square_apparent_look_prefix(p->cave, auxst->grid);

	/* Display a message */
	if (p->wizard) {
		strnfmt(out_val, sizeof(out_val),
			"%s%s%s%s, %s (%d:%d, noise=%d, scent=%d).",
			auxst->phrase1,
			lphrase2,
			lphrase3,
			name,
			auxst->coord_desc,
			auxst->grid.y,
			auxst->grid.x,
			(int)c->noise.grids[auxst->grid.y][auxst->grid.x],
			(int)c->scent.grids[auxst->grid.y][auxst->grid.x]);
	} else {
		strnfmt(out_val, sizeof(out_val),
			"%s%s%s%s, %s.",
			auxst->phrase1,
			lphrase2,
			lphrase3,
			name,
			auxst->coord_desc);
	}

	prt(out_val, 0, 0);
	move_cursor_relative(auxst->grid.y, auxst->grid.x);
	auxst->press = inkey_m();

	/*
	 * Stop on right click of mouse or everything but "return"/"space" for
	 * a key.
	 */
	return (auxst->press.type == EVT_MOUSE
			&& auxst->press.mouse.button == 2)
		|| (auxst->press.type != EVT_MOUSE
			&& auxst->press.key.code != KC_ENTER
			&& auxst->press.key.code != ' ');
}